

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void nivalis::detail::sub_var_ast(AST *ast,int64_t addr,double value)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint64_t in_RSI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  anon_union_8_3_343d95dd_for_ASTNode_1 in_XMM0_Qa;
  size_t i;
  ulong local_20;
  
  for (local_20 = 0;
      sVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                        (in_RDI), local_20 < sVar2; local_20 = local_20 + 1) {
    pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[](in_RDI,local_20);
    bVar1 = OpCode::has_ref(pvVar3->opcode);
    if (((bVar1) &&
        (pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](in_RDI,local_20), pvVar3->opcode != 3)) &&
       (pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                 operator[](in_RDI,local_20), (pvVar3->field_1).ref == in_RSI)) {
      pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](in_RDI,local_20);
      pvVar3->opcode = 1;
      pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](in_RDI,local_20);
      pvVar3->field_1 = in_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void sub_var_ast(Expr::AST& ast, int64_t addr, double value) {
    for (size_t i = 0; i < ast.size(); ++i) {
        if (OpCode::has_ref(ast[i].opcode) &&
            ast[i].opcode != OpCode::arg &&
            ast[i].ref == addr) {
            ast[i].opcode = OpCode::val;
            ast[i].val = value;
        }
    }
}